

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::NotCondition::Evaluate
          (NotCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  bool *pbVar4;
  optional<bool> *out_local;
  int version_local;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *expanders_local;
  NotCondition *this_local;
  
  std::optional<bool>::reset(out);
  pCVar3 = std::
           unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
           ::operator->(&this->SubCondition);
  uVar2 = (*pCVar3->_vptr_Condition[2])(pCVar3,expanders,(ulong)(uint)version,out);
  if ((uVar2 & 1) == 0) {
    std::optional<bool>::reset(out);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)out);
    if (bVar1) {
      pbVar4 = std::optional<bool>::operator*(out);
      bVar1 = *pbVar4;
      pbVar4 = std::optional<bool>::operator*(out);
      *pbVar4 = (bool)((bVar1 ^ 0xffU) & 1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCMakePresetsGraphInternal::NotCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  out.reset();
  if (!this->SubCondition->Evaluate(expanders, version, out)) {
    out.reset();
    return false;
  }
  if (out) {
    *out = !*out;
  }
  return true;
}